

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int transfer_set_delivery_tag(TRANSFER_HANDLE transfer,delivery_tag delivery_tag_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  delivery_tag value;
  AMQP_VALUE delivery_tag_amqp_value;
  TRANSFER_INSTANCE *transfer_instance;
  int result;
  TRANSFER_HANDLE transfer_local;
  delivery_tag delivery_tag_value_local;
  
  if (transfer == (TRANSFER_HANDLE)0x0) {
    transfer_instance._4_4_ = 0x1d3f;
  }
  else {
    value._12_4_ = 0;
    value.bytes = (void *)SUB128(delivery_tag_value._0_12_,0);
    value.length = SUB124(delivery_tag_value._0_12_,8);
    item_value = amqpvalue_create_delivery_tag(value);
    if (item_value == (AMQP_VALUE)0x0) {
      transfer_instance._4_4_ = 0x1d47;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(transfer->composite_value,2,item_value);
      if (iVar1 == 0) {
        transfer_instance._4_4_ = 0;
      }
      else {
        transfer_instance._4_4_ = 0x1d4d;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return transfer_instance._4_4_;
}

Assistant:

int transfer_set_delivery_tag(TRANSFER_HANDLE transfer, delivery_tag delivery_tag_value)
{
    int result;

    if (transfer == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        AMQP_VALUE delivery_tag_amqp_value = amqpvalue_create_delivery_tag(delivery_tag_value);
        if (delivery_tag_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(transfer_instance->composite_value, 2, delivery_tag_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(delivery_tag_amqp_value);
        }
    }

    return result;
}